

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O1

string * __thiscall
tinyusdz::crate::ValueRep::GetStringRepr_abi_cxx11_(string *__return_storage_ptr__,ValueRep *this)

{
  ostream *poVar1;
  int32_t type_id;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_198,"ty: ",4);
  poVar1 = (ostream *)::std::ostream::operator<<(local_198,(uint)*(byte *)((long)&this->data + 6));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  GetCrateDataTypeName_abi_cxx11_
            (&local_1c8,(crate *)(ulong)*(byte *)((long)&this->data + 6),type_id);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), isArray: ",0xc);
  poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", isInlined: ",0xd);
  poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", isCompressed: ",0x10);
  poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", payload: ",0xb);
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string GetStringRepr() const {
    std::stringstream ss;
    ss << "ty: " << static_cast<int>(GetType()) << "(" << GetCrateDataTypeName(GetType()) << "), isArray: " << IsArray()
       << ", isInlined: " << IsInlined() << ", isCompressed: " << IsCompressed()
       << ", payload: " << GetPayload();

    return ss.str();
  }